

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  size_t sVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  bitset_container_t *container;
  run_container_t *container_00;
  array_container_t *container_01;
  bool bVar6;
  bool bVar7;
  array_container_t *c_2;
  size_t containersize_2;
  run_container_t *c_1;
  size_t containersize_1;
  uint16_t n_runs;
  bitset_container_t *c;
  size_t containersize;
  _Bool isrun;
  _Bool isbitmap;
  uint32_t thiscard;
  uint16_t tmp_1;
  int32_t k_1;
  uint16_t tmp;
  int32_t k;
  _Bool is_ok;
  uint16_t *keyscards;
  int32_t s;
  _Bool hasrun;
  char *bitmapOfRunContainers;
  int32_t size;
  uint32_t cookie;
  size_t *readbytes_local;
  size_t maxbytes_local;
  char *buf_local;
  roaring_array_t *answer_local;
  
  *readbytes = 4;
  if (maxbytes < *readbytes) {
    fprintf(_stderr,"Ran out of bytes while reading first 4 bytes.\n");
    answer_local._7_1_ = false;
  }
  else {
    uVar4 = *(uint *)buf;
    maxbytes_local = (size_t)(buf + 4);
    if (((uVar4 & 0xffff) == 0x303b) || (uVar4 == 0x303a)) {
      if ((uVar4 & 0xffff) == 0x303b) {
        bitmapOfRunContainers._0_4_ = (uVar4 >> 0x10) + 1;
      }
      else {
        *readbytes = *readbytes + 4;
        if (maxbytes < *readbytes) {
          fprintf(_stderr,"Ran out of bytes while reading second part of the cookie.\n");
          return false;
        }
        bitmapOfRunContainers._0_4_ = *(uint *)maxbytes_local;
        maxbytes_local = (size_t)(buf + 8);
      }
      if ((int)(uint)bitmapOfRunContainers < 0x10001) {
        _s = 0;
        bVar6 = (uVar4 & 0xffff) == 0x303b;
        sVar5 = maxbytes;
        if (bVar6) {
          iVar3 = (int)((uint)bitmapOfRunContainers + 7) / 8;
          sVar5 = (long)(int)((uint)bitmapOfRunContainers + 7) % 8 & 0xffffffff;
          *readbytes = (long)iVar3 + *readbytes;
          if (maxbytes < *readbytes) {
            fprintf(_stderr,"Ran out of bytes while reading run bitmap.\n",sVar5);
            return false;
          }
          _s = maxbytes_local;
          maxbytes_local = maxbytes_local + (long)iVar3;
        }
        sVar1 = maxbytes_local;
        *readbytes = (long)(int)((uint)bitmapOfRunContainers << 1) * 2 + *readbytes;
        if (maxbytes < *readbytes) {
          fprintf(_stderr,"Ran out of bytes while reading key-cardinality array.\n",sVar5);
          answer_local._7_1_ = false;
        }
        else {
          sVar5 = (long)(int)((uint)bitmapOfRunContainers << 1) * 2 + maxbytes_local;
          _Var2 = ra_init_with_capacity(answer,(uint)bitmapOfRunContainers);
          if (_Var2) {
            for (k_1 = 0; k_1 < (int)(uint)bitmapOfRunContainers; k_1 = k_1 + 1) {
              answer->keys[k_1] = *(uint16_t *)(maxbytes_local + (long)(k_1 << 1) * 2);
            }
            if ((!bVar6) || (maxbytes_local = sVar5, 3 < (int)(uint)bitmapOfRunContainers)) {
              *readbytes = (long)(int)((uint)bitmapOfRunContainers << 2) + *readbytes;
              if (maxbytes < *readbytes) {
                fprintf(_stderr,"Ran out of bytes while reading offsets.\n");
                ra_clear(answer);
                return false;
              }
              maxbytes_local = sVar5 + (long)(int)((uint)bitmapOfRunContainers << 2);
            }
            for (thiscard = 0; (int)thiscard < (int)(uint)bitmapOfRunContainers;
                thiscard = thiscard + 1) {
              uVar4 = *(ushort *)(sVar1 + 2 + (long)(int)(thiscard << 1) * 2) + 1;
              containersize._7_1_ = 0x1000 < uVar4;
              bVar7 = false;
              if (bVar6) {
                bVar7 = ((int)*(char *)(_s + (long)((int)thiscard / 8)) &
                        1 << ((byte)((long)(int)thiscard % 8) & 0x1f)) != 0;
                containersize._7_1_ = !bVar7 && containersize._7_1_;
              }
              if (containersize._7_1_) {
                *readbytes = *readbytes + 0x2000;
                if (maxbytes < *readbytes) {
                  fprintf(_stderr,"Running out of bytes while reading a bitset container.\n");
                  ra_clear(answer);
                  return false;
                }
                container = bitset_container_create();
                if (container == (bitset_container_t *)0x0) {
                  fprintf(_stderr,"Failed to allocate memory for a bitset container.\n");
                  ra_clear(answer);
                  return false;
                }
                answer->size = answer->size + 1;
                iVar3 = bitset_container_read(uVar4,container,(char *)maxbytes_local);
                answer->containers[(int)thiscard] = container;
                answer->typecodes[(int)thiscard] = '\x01';
              }
              else if (bVar7) {
                *readbytes = *readbytes + 2;
                if (maxbytes < *readbytes) {
                  fprintf(_stderr,"Running out of bytes while reading a run container (header).\n");
                  ra_clear(answer);
                  return false;
                }
                *readbytes = (ulong)*(ushort *)maxbytes_local * 4 + *readbytes;
                if (maxbytes < *readbytes) {
                  fprintf(_stderr,"Running out of bytes while reading a run container.\n");
                  ra_clear(answer);
                  return false;
                }
                container_00 = run_container_create();
                if (container_00 == (run_container_t *)0x0) {
                  fprintf(_stderr,"Failed to allocate memory for a run container.\n");
                  ra_clear(answer);
                  return false;
                }
                answer->size = answer->size + 1;
                iVar3 = run_container_read(uVar4,container_00,(char *)maxbytes_local);
                answer->containers[(int)thiscard] = container_00;
                answer->typecodes[(int)thiscard] = '\x03';
              }
              else {
                *readbytes = (ulong)uVar4 * 2 + *readbytes;
                if (maxbytes < *readbytes) {
                  fprintf(_stderr,"Running out of bytes while reading an array container.\n");
                  ra_clear(answer);
                  return false;
                }
                container_01 = array_container_create_given_capacity(uVar4);
                if (container_01 == (array_container_t *)0x0) {
                  fprintf(_stderr,"Failed to allocate memory for an array container.\n");
                  ra_clear(answer);
                  return false;
                }
                answer->size = answer->size + 1;
                iVar3 = array_container_read(uVar4,container_01,(char *)maxbytes_local);
                answer->containers[(int)thiscard] = container_01;
                answer->typecodes[(int)thiscard] = '\x02';
              }
              maxbytes_local = maxbytes_local + (long)iVar3;
            }
            answer_local._7_1_ = true;
          }
          else {
            fprintf(_stderr,"Failed to allocate memory for roaring array. Bailing out.\n");
            answer_local._7_1_ = false;
          }
        }
      }
      else {
        fprintf(_stderr,"You cannot have so many containers, the data must be corrupted: %d\n",
                (ulong)(uint)bitmapOfRunContainers);
        answer_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"I failed to find one of the right cookies. Found %u\n",(ulong)uVar4);
      answer_local._7_1_ = false;
    }
  }
  return answer_local._7_1_;
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf, const size_t maxbytes, size_t * readbytes) {
    *readbytes = sizeof(int32_t);// for cookie
    if(*readbytes > maxbytes) {
      fprintf(stderr, "Ran out of bytes while reading first 4 bytes.\n");
      return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        fprintf(stderr, "I failed to find one of the right cookies. Found %" PRIu32 "\n",
                cookie);
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if(*readbytes > maxbytes) {
          fprintf(stderr, "Ran out of bytes while reading second part of the cookie.\n");
          return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size > (1<<16)) {
       fprintf(stderr, "You cannot have so many containers, the data must be corrupted: %" PRId32 "\n",
                size);
       return false; // logically impossible
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if(*readbytes > maxbytes) {// data is corrupted?
          fprintf(stderr, "Ran out of bytes while reading run bitmap.\n");
          return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if(*readbytes > maxbytes) {
      fprintf(stderr, "Ran out of bytes while reading key-cardinality array.\n");
      return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        fprintf(stderr, "Failed to allocate memory for roaring array. Bailing out.\n");
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2*k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if(*readbytes > maxbytes) {// data is corrupted?
          fprintf(stderr, "Ran out of bytes while reading offsets.\n");
          ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
          return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2*k+1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if(hasrun) {
          if((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
            isbitmap = false;
            isrun = true;
          }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize = BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {
              fprintf(stderr, "Running out of bytes while reading a bitset container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for a bitset container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if(*readbytes > maxbytes) {
              fprintf(stderr, "Running out of bytes while reading a run container (header).\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {// data is corrupted?
              fprintf(stderr, "Running out of bytes while reading a run container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for a run container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {// data is corrupted?
              fprintf(stderr, "Running out of bytes while reading an array container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for an array container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}